

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx2.cpp
# Opt level: O3

void ncnn::pack_B_tile_fp32_to_int8_avx2
               (Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk,float scale)

{
  float *pfVar1;
  void *pvVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  int iVar5;
  size_t *psVar6;
  undefined1 (*pauVar7) [16];
  long lVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  float *pfVar18;
  ulong uVar19;
  ulong uVar20;
  ulong *puVar21;
  long lVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar72 [32];
  undefined1 auVar69 [16];
  undefined1 auVar74 [32];
  undefined1 auVar70 [16];
  undefined1 in_ZMM11 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  float fVar81;
  undefined1 auVar85 [32];
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  undefined1 in_ZMM12 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar94 [32];
  undefined1 auVar71 [32];
  undefined1 auVar73 [32];
  undefined1 auVar75 [32];
  
  iVar5 = cpu_support_x86_avx_vnni_int8();
  if (iVar5 != 0) {
    pack_B_tile_fp32_to_int8_avxvnniint8(B,BT,j,max_jj,k,max_kk,scale);
    return;
  }
  iVar5 = cpu_support_x86_avx_vnni();
  auVar27 = _DAT_005b38f0;
  auVar24 = _DAT_005b38e0;
  if (iVar5 == 0) {
    psVar6 = (size_t *)&B->w;
    if (B->dims == 3) {
      psVar6 = &B->cstep;
    }
    iVar5 = B->elempack;
    iVar11 = (int)*psVar6;
    pauVar7 = (undefined1 (*) [16])BT->data;
    uVar20 = 0;
    lVar8 = (long)j;
    lVar9 = (long)iVar11;
    if (7 < max_jj) {
      lVar13 = (long)(iVar11 << 2);
      auVar94._4_4_ = iVar11;
      auVar94._0_4_ = iVar11;
      auVar94._8_4_ = iVar11;
      auVar94._12_4_ = iVar11;
      auVar94._16_4_ = iVar11;
      auVar94._20_4_ = iVar11;
      auVar94._24_4_ = iVar11;
      auVar94._28_4_ = iVar11;
      vpmulld_avx2(auVar94,_DAT_005a82e0);
      uVar14 = max_kk & 0xfffffffe;
      auVar33._8_4_ = 0x80000000;
      auVar33._0_8_ = 0x8000000080000000;
      auVar33._12_4_ = 0x80000000;
      auVar33._16_4_ = 0x80000000;
      auVar33._20_4_ = 0x80000000;
      auVar33._24_4_ = 0x80000000;
      auVar33._28_4_ = 0x80000000;
      auVar37._8_4_ = 0x3f000000;
      auVar37._0_8_ = 0x3f0000003f000000;
      auVar37._12_4_ = 0x3f000000;
      auVar37._16_4_ = 0x3f000000;
      auVar37._20_4_ = 0x3f000000;
      auVar37._24_4_ = 0x3f000000;
      auVar37._28_4_ = 0x3f000000;
      auVar41._8_2_ = 0x7f;
      auVar41._0_8_ = 0x7f007f007f007f;
      auVar41._10_2_ = 0x7f;
      auVar41._12_2_ = 0x7f;
      auVar41._14_2_ = 0x7f;
      auVar41._16_2_ = 0x7f;
      auVar41._18_2_ = 0x7f;
      auVar41._20_2_ = 0x7f;
      auVar41._22_2_ = 0x7f;
      auVar41._24_2_ = 0x7f;
      auVar41._26_2_ = 0x7f;
      auVar41._28_2_ = 0x7f;
      auVar41._30_2_ = 0x7f;
      auVar53._8_2_ = 0xff81;
      auVar53._0_8_ = 0xff81ff81ff81ff81;
      auVar53._10_2_ = 0xff81;
      auVar53._12_2_ = 0xff81;
      auVar53._14_2_ = 0xff81;
      auVar53._16_2_ = 0xff81;
      auVar53._18_2_ = 0xff81;
      auVar53._20_2_ = 0xff81;
      auVar53._22_2_ = 0xff81;
      auVar53._24_2_ = 0xff81;
      auVar53._26_2_ = 0xff81;
      auVar53._28_2_ = 0xff81;
      auVar53._30_2_ = 0xff81;
      in_ZMM6 = ZEXT3264(auVar53);
      auVar54._8_2_ = 0x7f;
      auVar54._0_8_ = 0x7f007f007f007f;
      auVar54._10_2_ = 0x7f;
      auVar54._12_2_ = 0x7f;
      auVar54._14_2_ = 0x7f;
      auVar67._8_2_ = 0xff81;
      auVar67._0_8_ = 0xff81ff81ff81ff81;
      auVar67._10_2_ = 0xff81;
      auVar67._12_2_ = 0xff81;
      auVar67._14_2_ = 0xff81;
      uVar15 = 0;
      do {
        pfVar18 = (float *)((long)B->data + (long)(iVar5 * k) * 4 + (lVar8 + uVar15) * lVar9 * 4);
        if (iVar5 == 8) {
          uVar12 = 0;
          if (1 < max_kk) {
            iVar10 = 1;
            do {
              auVar76._0_4_ = scale * *pfVar18;
              auVar76._4_4_ = scale * pfVar18[1];
              auVar76._8_4_ = scale * pfVar18[2];
              auVar76._12_4_ = scale * pfVar18[3];
              auVar76._16_4_ = scale * pfVar18[4];
              auVar76._20_4_ = scale * pfVar18[5];
              auVar76._28_36_ = in_ZMM11._28_36_;
              auVar76._24_4_ = scale * pfVar18[6];
              auVar86._0_4_ = scale * pfVar18[8];
              auVar86._4_4_ = scale * pfVar18[9];
              auVar86._8_4_ = scale * pfVar18[10];
              auVar86._12_4_ = scale * pfVar18[0xb];
              auVar86._16_4_ = scale * pfVar18[0xc];
              auVar86._20_4_ = scale * pfVar18[0xd];
              auVar86._28_36_ = in_ZMM12._28_36_;
              auVar86._24_4_ = scale * pfVar18[0xe];
              auVar94 = vandps_avx(auVar76._0_32_,auVar33);
              auVar71 = vandps_avx(auVar86._0_32_,auVar33);
              auVar94 = vorps_avx(auVar94,auVar37);
              auVar71 = vorps_avx(auVar71,auVar37);
              auVar84._0_4_ = (int)(auVar76._0_4_ + auVar94._0_4_);
              auVar84._4_4_ = (int)(auVar76._4_4_ + auVar94._4_4_);
              auVar84._8_4_ = (int)(auVar76._8_4_ + auVar94._8_4_);
              auVar84._12_4_ = (int)(auVar76._12_4_ + auVar94._12_4_);
              auVar84._16_4_ = (int)(auVar76._16_4_ + auVar94._16_4_);
              auVar84._20_4_ = (int)(auVar76._20_4_ + auVar94._20_4_);
              auVar84._24_4_ = (int)(auVar76._24_4_ + auVar94._24_4_);
              auVar84._28_4_ = (int)(in_ZMM11._28_4_ + auVar94._28_4_);
              auVar82._0_4_ = (int)(auVar86._0_4_ + auVar71._0_4_);
              auVar82._4_4_ = (int)(auVar86._4_4_ + auVar71._4_4_);
              auVar82._8_4_ = (int)(auVar86._8_4_ + auVar71._8_4_);
              auVar82._12_4_ = (int)(auVar86._12_4_ + auVar71._12_4_);
              auVar82._16_4_ = (int)(auVar86._16_4_ + auVar71._16_4_);
              auVar82._20_4_ = (int)(auVar86._20_4_ + auVar71._20_4_);
              auVar82._24_4_ = (int)(auVar86._24_4_ + auVar71._24_4_);
              auVar82._28_4_ = (int)(in_ZMM12._28_4_ + auVar71._28_4_);
              auVar94 = vpackssdw_avx2(auVar84,auVar82);
              auVar94 = vpermq_avx2(auVar94,0xd8);
              auVar94 = vpminsw_avx2(auVar94,auVar41);
              auVar94 = vpmaxsw_avx2(auVar94,auVar53);
              in_ZMM12 = ZEXT1664(auVar94._16_16_);
              auVar68 = vpacksswb_avx(auVar94._0_16_,auVar94._16_16_);
              auVar68 = vpshufb_avx(auVar68,auVar24);
              in_ZMM11 = ZEXT1664(auVar68);
              *pauVar7 = auVar68;
              pauVar7 = pauVar7 + 1;
              pfVar18 = pfVar18 + 0x10;
              iVar10 = iVar10 + 2;
              uVar12 = uVar14;
            } while (iVar10 < max_kk);
          }
          iVar10 = max_kk - uVar12;
          if (iVar10 != 0 && (int)uVar12 <= max_kk) {
            do {
              auVar77._0_4_ = scale * *pfVar18;
              auVar77._4_4_ = scale * pfVar18[1];
              auVar77._8_4_ = scale * pfVar18[2];
              auVar77._12_4_ = scale * pfVar18[3];
              auVar77._16_4_ = scale * pfVar18[4];
              auVar77._20_4_ = scale * pfVar18[5];
              auVar77._28_36_ = in_ZMM11._28_36_;
              auVar77._24_4_ = scale * pfVar18[6];
              auVar94 = vandps_avx(auVar77._0_32_,auVar33);
              auVar94 = vorps_avx(auVar94,auVar37);
              auVar68._0_4_ = (int)(auVar77._0_4_ + auVar94._0_4_);
              auVar68._4_4_ = (int)(auVar77._4_4_ + auVar94._4_4_);
              auVar68._8_4_ = (int)(auVar77._8_4_ + auVar94._8_4_);
              auVar68._12_4_ = (int)(auVar77._12_4_ + auVar94._12_4_);
              auVar71._16_4_ = (int)(auVar77._16_4_ + auVar94._16_4_);
              auVar71._0_16_ = auVar68;
              auVar71._20_4_ = (int)(auVar77._20_4_ + auVar94._20_4_);
              auVar71._24_4_ = (int)(auVar77._24_4_ + auVar94._24_4_);
              auVar71._28_4_ = (int)(in_ZMM11._28_4_ + auVar94._28_4_);
              in_ZMM12 = ZEXT1664(auVar71._16_16_);
              auVar68 = vpackssdw_avx(auVar68,auVar71._16_16_);
              auVar68 = vpminsw_avx(auVar68,auVar54);
              auVar68 = vpmaxsw_avx(auVar68,auVar67);
              auVar68 = vpacksswb_avx(auVar68,auVar68);
              in_ZMM11 = ZEXT1664(auVar68);
              *(long *)*pauVar7 = auVar68._0_8_;
              pauVar7 = (undefined1 (*) [16])(*pauVar7 + 8);
              pfVar18 = pfVar18 + 8;
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
          }
        }
        if (iVar5 == 4) {
          uVar12 = 0;
          if (1 < max_kk) {
            iVar10 = 1;
            do {
              auVar78._0_4_ = scale * *pfVar18;
              auVar78._4_4_ = scale * pfVar18[1];
              auVar78._8_4_ = scale * pfVar18[2];
              auVar78._12_4_ = scale * pfVar18[3];
              auVar78._16_4_ = scale * pfVar18[4];
              auVar78._20_4_ = scale * pfVar18[5];
              auVar78._28_36_ = in_ZMM11._28_36_;
              auVar78._24_4_ = scale * pfVar18[6];
              pfVar1 = pfVar18 + lVar13;
              auVar87._0_4_ = scale * *pfVar1;
              auVar87._4_4_ = scale * pfVar1[1];
              auVar87._8_4_ = scale * pfVar1[2];
              auVar87._12_4_ = scale * pfVar1[3];
              auVar87._16_4_ = scale * pfVar1[4];
              auVar87._20_4_ = scale * pfVar1[5];
              auVar87._28_36_ = in_ZMM12._28_36_;
              auVar87._24_4_ = scale * pfVar1[6];
              auVar94 = vandps_avx(auVar78._0_32_,auVar33);
              auVar71 = vandps_avx(auVar87._0_32_,auVar33);
              auVar94 = vorps_avx(auVar94,auVar37);
              auVar71 = vorps_avx(auVar71,auVar37);
              auVar72._0_4_ = (int)(auVar78._0_4_ + auVar94._0_4_);
              auVar72._4_4_ = (int)(auVar78._4_4_ + auVar94._4_4_);
              auVar72._8_4_ = (int)(auVar78._8_4_ + auVar94._8_4_);
              auVar72._12_4_ = (int)(auVar78._12_4_ + auVar94._12_4_);
              auVar72._16_4_ = (int)(auVar78._16_4_ + auVar94._16_4_);
              auVar72._20_4_ = (int)(auVar78._20_4_ + auVar94._20_4_);
              auVar72._24_4_ = (int)(auVar78._24_4_ + auVar94._24_4_);
              auVar72._28_4_ = (int)(in_ZMM11._28_4_ + auVar94._28_4_);
              auVar83._0_4_ = (int)(auVar87._0_4_ + auVar71._0_4_);
              auVar83._4_4_ = (int)(auVar87._4_4_ + auVar71._4_4_);
              auVar83._8_4_ = (int)(auVar87._8_4_ + auVar71._8_4_);
              auVar83._12_4_ = (int)(auVar87._12_4_ + auVar71._12_4_);
              auVar83._16_4_ = (int)(auVar87._16_4_ + auVar71._16_4_);
              auVar83._20_4_ = (int)(auVar87._20_4_ + auVar71._20_4_);
              auVar83._24_4_ = (int)(auVar87._24_4_ + auVar71._24_4_);
              auVar83._28_4_ = (int)(in_ZMM12._28_4_ + auVar71._28_4_);
              auVar94 = vpackssdw_avx2(auVar72,auVar83);
              auVar94 = vpermq_avx2(auVar94,0xd8);
              auVar94 = vpminsw_avx2(auVar94,auVar41);
              auVar94 = vpmaxsw_avx2(auVar94,auVar53);
              in_ZMM12 = ZEXT1664(auVar94._16_16_);
              auVar68 = vpacksswb_avx(auVar94._0_16_,auVar94._16_16_);
              auVar68 = vpshufb_avx(auVar68,auVar27);
              in_ZMM11 = ZEXT1664(auVar68);
              *pauVar7 = auVar68;
              pauVar7 = pauVar7 + 1;
              pfVar18 = pfVar18 + 8;
              iVar10 = iVar10 + 2;
              uVar12 = uVar14;
            } while (iVar10 < max_kk);
          }
          iVar10 = max_kk - uVar12;
          if (iVar10 != 0 && (int)uVar12 <= max_kk) {
            do {
              auVar3._4_4_ = pfVar18[1] * scale;
              auVar3._0_4_ = *pfVar18 * scale;
              auVar3._8_4_ = pfVar18[2] * scale;
              auVar3._12_4_ = pfVar18[3] * scale;
              auVar3._16_4_ = pfVar18[lVar13 + 4] * scale;
              auVar3._20_4_ = pfVar18[lVar13 + 5] * scale;
              auVar3._24_4_ = pfVar18[lVar13 + 6] * scale;
              auVar3._28_4_ = pfVar18[lVar13 + 7];
              auVar94 = vandps_avx(auVar3,auVar33);
              auVar94 = vorps_avx(auVar94,auVar37);
              auVar69._0_4_ = (int)(*pfVar18 * scale + auVar94._0_4_);
              auVar69._4_4_ = (int)(pfVar18[1] * scale + auVar94._4_4_);
              auVar69._8_4_ = (int)(pfVar18[2] * scale + auVar94._8_4_);
              auVar69._12_4_ = (int)(pfVar18[3] * scale + auVar94._12_4_);
              auVar73._16_4_ = (int)(pfVar18[lVar13 + 4] * scale + auVar94._16_4_);
              auVar73._0_16_ = auVar69;
              auVar73._20_4_ = (int)(pfVar18[lVar13 + 5] * scale + auVar94._20_4_);
              auVar73._24_4_ = (int)(pfVar18[lVar13 + 6] * scale + auVar94._24_4_);
              auVar73._28_4_ = (int)(pfVar18[lVar13 + 7] + auVar94._28_4_);
              in_ZMM12 = ZEXT1664(auVar73._16_16_);
              auVar68 = vpackssdw_avx(auVar69,auVar73._16_16_);
              auVar68 = vpminsw_avx(auVar68,auVar54);
              auVar68 = vpmaxsw_avx(auVar68,auVar67);
              auVar68 = vpacksswb_avx(auVar68,auVar68);
              in_ZMM11 = ZEXT1664(auVar68);
              *(long *)*pauVar7 = auVar68._0_8_;
              pauVar7 = (undefined1 (*) [16])(*pauVar7 + 8);
              pfVar18 = pfVar18 + 4;
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
          }
        }
        if (iVar5 == 1) {
          uVar12 = 0;
          if (1 < max_kk) {
            iVar10 = 1;
            do {
              auVar94 = vpcmpeqd_avx2(in_ZMM11._0_32_,in_ZMM11._0_32_);
              auVar84 = vgatherdps(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar94);
              auVar94 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
              auVar94 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar94);
              auVar79._0_4_ = auVar84._0_4_ * scale;
              auVar79._4_4_ = auVar84._4_4_ * scale;
              auVar79._8_4_ = auVar84._8_4_ * scale;
              auVar79._12_4_ = auVar84._12_4_ * scale;
              auVar79._16_4_ = auVar84._16_4_ * scale;
              auVar79._20_4_ = auVar84._20_4_ * scale;
              auVar79._28_36_ = SUB6436(ZEXT3264((undefined1  [32])0x0),0x1c);
              auVar79._24_4_ = auVar84._24_4_ * scale;
              fVar81 = auVar94._0_4_ * scale;
              fVar88 = auVar94._4_4_ * scale;
              auVar4._4_4_ = fVar88;
              auVar4._0_4_ = fVar81;
              fVar89 = auVar94._8_4_ * scale;
              auVar4._8_4_ = fVar89;
              fVar90 = auVar94._12_4_ * scale;
              auVar4._12_4_ = fVar90;
              fVar91 = auVar94._16_4_ * scale;
              auVar4._16_4_ = fVar91;
              fVar92 = auVar94._20_4_ * scale;
              auVar4._20_4_ = fVar92;
              fVar93 = auVar94._24_4_ * scale;
              auVar4._24_4_ = fVar93;
              auVar4._28_4_ = auVar84._28_4_;
              auVar94 = vandps_avx(auVar79._0_32_,auVar33);
              auVar71 = vandps_avx(auVar4,auVar33);
              auVar94 = vorps_avx(auVar94,auVar37);
              auVar71 = vorps_avx(auVar71,auVar37);
              auVar74._0_4_ = (int)(auVar79._0_4_ + auVar94._0_4_);
              auVar74._4_4_ = (int)(auVar79._4_4_ + auVar94._4_4_);
              auVar74._8_4_ = (int)(auVar79._8_4_ + auVar94._8_4_);
              auVar74._12_4_ = (int)(auVar79._12_4_ + auVar94._12_4_);
              auVar74._16_4_ = (int)(auVar79._16_4_ + auVar94._16_4_);
              auVar74._20_4_ = (int)(auVar79._20_4_ + auVar94._20_4_);
              auVar74._24_4_ = (int)(auVar79._24_4_ + auVar94._24_4_);
              auVar74._28_4_ = (int)(SUB644(ZEXT3264((undefined1  [32])0x0),0x1c) + auVar94._28_4_);
              auVar85._0_4_ = (int)(fVar81 + auVar71._0_4_);
              auVar85._4_4_ = (int)(fVar88 + auVar71._4_4_);
              auVar85._8_4_ = (int)(fVar89 + auVar71._8_4_);
              auVar85._12_4_ = (int)(fVar90 + auVar71._12_4_);
              auVar85._16_4_ = (int)(fVar91 + auVar71._16_4_);
              auVar85._20_4_ = (int)(fVar92 + auVar71._20_4_);
              auVar85._24_4_ = (int)(fVar93 + auVar71._24_4_);
              auVar85._28_4_ = (int)(auVar84._28_4_ + auVar71._28_4_);
              auVar94 = vpackssdw_avx2(auVar74,auVar85);
              auVar94 = vpermq_avx2(auVar94,0xd8);
              auVar94 = vpminsw_avx2(auVar94,auVar41);
              auVar94 = vpmaxsw_avx2(auVar94,auVar53);
              in_ZMM12 = ZEXT1664(auVar94._16_16_);
              auVar68 = vpacksswb_avx(auVar94._0_16_,auVar94._16_16_);
              auVar68 = vpshufb_avx(auVar68,auVar24);
              in_ZMM11 = ZEXT1664(auVar68);
              *pauVar7 = auVar68;
              pauVar7 = pauVar7 + 1;
              iVar10 = iVar10 + 2;
              uVar12 = uVar14;
            } while (iVar10 < max_kk);
          }
          iVar10 = max_kk - uVar12;
          if (iVar10 != 0 && (int)uVar12 <= max_kk) {
            do {
              auVar94 = vpcmpeqd_avx2(in_ZMM11._0_32_,in_ZMM11._0_32_);
              auVar94 = vgatherdps(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar94);
              auVar80._0_4_ = auVar94._0_4_ * scale;
              auVar80._4_4_ = auVar94._4_4_ * scale;
              auVar80._8_4_ = auVar94._8_4_ * scale;
              auVar80._12_4_ = auVar94._12_4_ * scale;
              auVar80._16_4_ = auVar94._16_4_ * scale;
              auVar80._20_4_ = auVar94._20_4_ * scale;
              auVar80._28_36_ = SUB6436(ZEXT3264((undefined1  [32])0x0),0x1c);
              auVar80._24_4_ = auVar94._24_4_ * scale;
              auVar94 = vandps_avx(auVar80._0_32_,auVar33);
              auVar94 = vorps_avx(auVar94,auVar37);
              auVar70._0_4_ = (int)(auVar80._0_4_ + auVar94._0_4_);
              auVar70._4_4_ = (int)(auVar80._4_4_ + auVar94._4_4_);
              auVar70._8_4_ = (int)(auVar80._8_4_ + auVar94._8_4_);
              auVar70._12_4_ = (int)(auVar80._12_4_ + auVar94._12_4_);
              auVar75._16_4_ = (int)(auVar80._16_4_ + auVar94._16_4_);
              auVar75._0_16_ = auVar70;
              auVar75._20_4_ = (int)(auVar80._20_4_ + auVar94._20_4_);
              auVar75._24_4_ = (int)(auVar80._24_4_ + auVar94._24_4_);
              auVar75._28_4_ = (int)(SUB644(ZEXT3264((undefined1  [32])0x0),0x1c) + auVar94._28_4_);
              in_ZMM12 = ZEXT1664(auVar75._16_16_);
              auVar68 = vpackssdw_avx(auVar70,auVar75._16_16_);
              auVar68 = vpminsw_avx(auVar68,auVar54);
              auVar68 = vpmaxsw_avx(auVar68,auVar67);
              auVar68 = vpacksswb_avx(auVar68,auVar68);
              in_ZMM11 = ZEXT1664(auVar68);
              *(long *)*pauVar7 = auVar68._0_8_;
              pauVar7 = (undefined1 (*) [16])(*pauVar7 + 8);
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
          }
        }
        uVar20 = uVar15 + 8;
        uVar19 = uVar15 + 0xf;
        uVar15 = uVar20;
      } while (uVar19 < (uint)max_jj);
    }
    lVar13 = (long)max_jj;
    if ((int)((uint)uVar20 | 3) < max_jj) {
      pvVar2 = B->data;
      auVar24._4_4_ = iVar11;
      auVar24._0_4_ = iVar11;
      auVar24._8_4_ = iVar11;
      auVar24._12_4_ = iVar11;
      vpmulld_avx(auVar24,_DAT_005a6910);
      auVar27._8_4_ = 0x80000000;
      auVar27._0_8_ = 0x8000000080000000;
      auVar27._12_4_ = 0x80000000;
      auVar30._8_4_ = 0x3f000000;
      auVar30._0_8_ = 0x3f0000003f000000;
      auVar30._12_4_ = 0x3f000000;
      auVar34._8_2_ = 0x7f;
      auVar34._0_8_ = 0x7f007f007f007f;
      auVar34._10_2_ = 0x7f;
      auVar34._12_2_ = 0x7f;
      auVar34._14_2_ = 0x7f;
      auVar38._8_2_ = 0xff81;
      auVar38._0_8_ = 0xff81ff81ff81ff81;
      auVar38._10_2_ = 0xff81;
      auVar38._12_2_ = 0xff81;
      auVar38._14_2_ = 0xff81;
      uVar15 = uVar20 & 0xffffffff;
      do {
        pfVar18 = (float *)((long)pvVar2 + (lVar8 + uVar15) * lVar9 * 4 + (long)(iVar5 * k) * 4);
        if (iVar5 == 4) {
          uVar14 = 0;
          if (1 < max_kk) {
            iVar11 = 1;
            do {
              auVar42._0_4_ = scale * *pfVar18;
              auVar42._4_4_ = scale * pfVar18[1];
              auVar42._8_4_ = scale * pfVar18[2];
              auVar42._12_4_ = scale * pfVar18[3];
              auVar55._0_4_ = scale * pfVar18[4];
              auVar55._4_4_ = scale * pfVar18[5];
              auVar55._8_4_ = scale * pfVar18[6];
              auVar55._12_4_ = scale * pfVar18[7];
              auVar68 = vunpcklps_avx(auVar42,auVar55);
              auVar67 = vunpckhps_avx(auVar42,auVar55);
              auVar24 = vandps_avx(auVar68,auVar27);
              auVar54 = vandps_avx(auVar67,auVar27);
              auVar24 = vorps_avx(auVar24,auVar30);
              auVar54 = vorps_avx(auVar54,auVar30);
              auVar56._0_4_ = (int)(auVar68._0_4_ + auVar24._0_4_);
              auVar56._4_4_ = (int)(auVar68._4_4_ + auVar24._4_4_);
              auVar56._8_4_ = (int)(auVar68._8_4_ + auVar24._8_4_);
              auVar56._12_4_ = (int)(auVar68._12_4_ + auVar24._12_4_);
              auVar43._0_4_ = (int)(auVar54._0_4_ + auVar67._0_4_);
              auVar43._4_4_ = (int)(auVar54._4_4_ + auVar67._4_4_);
              auVar43._8_4_ = (int)(auVar54._8_4_ + auVar67._8_4_);
              auVar43._12_4_ = (int)(auVar54._12_4_ + auVar67._12_4_);
              auVar24 = vpackssdw_avx(auVar56,auVar43);
              auVar24 = vpminsw_avx(auVar24,auVar34);
              auVar24 = vpmaxsw_avx(auVar24,auVar38);
              auVar24 = vpacksswb_avx(auVar24,auVar24);
              in_ZMM6 = ZEXT1664(auVar24);
              *(long *)*pauVar7 = auVar24._0_8_;
              pauVar7 = (undefined1 (*) [16])(*pauVar7 + 8);
              pfVar18 = pfVar18 + 8;
              iVar11 = iVar11 + 2;
              uVar14 = max_kk & 0xfffffffeU;
            } while (iVar11 < max_kk);
          }
          iVar11 = max_kk - uVar14;
          if (iVar11 != 0 && (int)uVar14 <= max_kk) {
            do {
              auVar44._0_4_ = scale * *pfVar18;
              auVar44._4_4_ = scale * pfVar18[1];
              auVar44._8_4_ = scale * pfVar18[2];
              auVar44._12_4_ = scale * pfVar18[3];
              auVar24 = vandps_avx(auVar44,auVar27);
              auVar24 = vorps_avx(auVar24,auVar30);
              auVar45._0_4_ = (int)(auVar44._0_4_ + auVar24._0_4_);
              auVar45._4_4_ = (int)(auVar44._4_4_ + auVar24._4_4_);
              auVar45._8_4_ = (int)(auVar44._8_4_ + auVar24._8_4_);
              auVar45._12_4_ = (int)(auVar44._12_4_ + auVar24._12_4_);
              auVar24 = vpackssdw_avx(auVar45,auVar45);
              auVar24 = vpminsw_avx(auVar24,auVar34);
              auVar24 = vpmaxsw_avx(auVar24,auVar38);
              auVar24 = vpacksswb_avx(auVar24,auVar24);
              in_ZMM6 = ZEXT1664(auVar24);
              *(int *)*pauVar7 = auVar24._0_4_;
              pauVar7 = (undefined1 (*) [16])(*pauVar7 + 4);
              pfVar18 = pfVar18 + 4;
              iVar11 = iVar11 + -1;
            } while (iVar11 != 0);
          }
        }
        if (iVar5 == 1) {
          uVar14 = 0;
          if (1 < max_kk) {
            iVar11 = 1;
            do {
              auVar24 = vpcmpeqd_avx(in_ZMM6._0_16_,in_ZMM6._0_16_);
              auVar67 = vgatherdps(ZEXT816(0) << 0x40,auVar24);
              auVar24 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
              auVar24 = vgatherdps(ZEXT816(0) << 0x40,auVar24);
              auVar54 = vunpcklps_avx(auVar67,auVar24);
              auVar24 = vunpckhps_avx(auVar67,auVar24);
              auVar46._0_4_ = auVar54._0_4_ * scale;
              auVar46._4_4_ = auVar54._4_4_ * scale;
              auVar46._8_4_ = auVar54._8_4_ * scale;
              auVar46._12_4_ = auVar54._12_4_ * scale;
              auVar57._0_4_ = auVar24._0_4_ * scale;
              auVar57._4_4_ = auVar24._4_4_ * scale;
              auVar57._8_4_ = auVar24._8_4_ * scale;
              auVar57._12_4_ = auVar24._12_4_ * scale;
              auVar24 = vandps_avx(auVar46,auVar27);
              auVar54 = vandps_avx(auVar57,auVar27);
              auVar24 = vorps_avx(auVar24,auVar30);
              auVar54 = vorps_avx(auVar54,auVar30);
              auVar47._0_4_ = (int)(auVar24._0_4_ + auVar46._0_4_);
              auVar47._4_4_ = (int)(auVar24._4_4_ + auVar46._4_4_);
              auVar47._8_4_ = (int)(auVar24._8_4_ + auVar46._8_4_);
              auVar47._12_4_ = (int)(auVar24._12_4_ + auVar46._12_4_);
              auVar58._0_4_ = (int)(auVar54._0_4_ + auVar57._0_4_);
              auVar58._4_4_ = (int)(auVar54._4_4_ + auVar57._4_4_);
              auVar58._8_4_ = (int)(auVar54._8_4_ + auVar57._8_4_);
              auVar58._12_4_ = (int)(auVar54._12_4_ + auVar57._12_4_);
              auVar24 = vpackssdw_avx(auVar47,auVar58);
              auVar24 = vpminsw_avx(auVar24,auVar34);
              auVar24 = vpmaxsw_avx(auVar24,auVar38);
              auVar24 = vpacksswb_avx(auVar24,auVar24);
              in_ZMM6 = ZEXT1664(auVar24);
              *(long *)*pauVar7 = auVar24._0_8_;
              pauVar7 = (undefined1 (*) [16])(*pauVar7 + 8);
              iVar11 = iVar11 + 2;
              uVar14 = max_kk & 0xfffffffeU;
            } while (iVar11 < max_kk);
          }
          iVar11 = max_kk - uVar14;
          if (iVar11 != 0 && (int)uVar14 <= max_kk) {
            do {
              auVar24 = vpcmpeqd_avx(in_ZMM6._0_16_,in_ZMM6._0_16_);
              auVar24 = vgatherdps((undefined1  [16])0x0,auVar24);
              auVar48._0_4_ = auVar24._0_4_ * scale;
              auVar48._4_4_ = auVar24._4_4_ * scale;
              auVar48._8_4_ = auVar24._8_4_ * scale;
              auVar48._12_4_ = auVar24._12_4_ * scale;
              auVar24 = vandps_avx(auVar48,auVar27);
              auVar24 = vorps_avx(auVar24,auVar30);
              auVar49._0_4_ = (int)(auVar48._0_4_ + auVar24._0_4_);
              auVar49._4_4_ = (int)(auVar48._4_4_ + auVar24._4_4_);
              auVar49._8_4_ = (int)(auVar48._8_4_ + auVar24._8_4_);
              auVar49._12_4_ = (int)(auVar48._12_4_ + auVar24._12_4_);
              auVar24 = vpackssdw_avx(auVar49,auVar49);
              auVar24 = vpminsw_avx(auVar24,auVar34);
              auVar24 = vpmaxsw_avx(auVar24,auVar38);
              auVar24 = vpacksswb_avx(auVar24,auVar24);
              in_ZMM6 = ZEXT1664(auVar24);
              *(int *)*pauVar7 = auVar24._0_4_;
              pauVar7 = (undefined1 (*) [16])(*pauVar7 + 4);
              iVar11 = iVar11 + -1;
            } while (iVar11 != 0);
          }
        }
        uVar20 = uVar15 + 4;
        lVar16 = uVar15 + 7;
        uVar15 = uVar20;
      } while (lVar16 < lVar13);
    }
    lVar16 = (long)k;
    if ((int)((uint)uVar20 | 1) < max_jj) {
      lVar23 = lVar8 + (uVar20 & 0xffffffff);
      lVar17 = (lVar23 * 4 + 4) * lVar9 + lVar16 * 4;
      lVar23 = lVar16 * 4 + lVar23 * lVar9 * 4;
      auVar25._8_4_ = 0x80000000;
      auVar25._0_8_ = 0x8000000080000000;
      auVar25._12_4_ = 0x80000000;
      auVar28._8_4_ = 0x3f000000;
      auVar28._0_8_ = 0x3f0000003f000000;
      auVar28._12_4_ = 0x3f000000;
      auVar31._8_2_ = 0x7f;
      auVar31._0_8_ = 0x7f007f007f007f;
      auVar31._10_2_ = 0x7f;
      auVar31._12_2_ = 0x7f;
      auVar31._14_2_ = 0x7f;
      auVar35._8_2_ = 0xff81;
      auVar35._0_8_ = 0xff81ff81ff81ff81;
      auVar35._10_2_ = 0xff81;
      auVar35._12_2_ = 0xff81;
      auVar35._14_2_ = 0xff81;
      auVar39._8_4_ = 0x80000000;
      auVar39._0_8_ = 0x8000000080000000;
      auVar39._12_4_ = 0x80000000;
      auVar50._8_4_ = 0x3effffff;
      auVar50._0_8_ = 0x3effffff3effffff;
      auVar50._12_4_ = 0x3effffff;
      uVar15 = uVar20 & 0xffffffff;
      do {
        pvVar2 = B->data;
        puVar21 = (ulong *)((long)pvVar2 + lVar16 * 4 + (uVar15 + lVar8) * lVar9 * 4);
        if (max_kk < 4) {
          uVar14 = 0;
        }
        else {
          iVar5 = 3;
          lVar22 = 0;
          do {
            pfVar18 = (float *)((long)pvVar2 + lVar22 * 2 + lVar23);
            auVar59._0_4_ = scale * *pfVar18;
            auVar59._4_4_ = scale * pfVar18[1];
            auVar59._8_4_ = scale * pfVar18[2];
            auVar59._12_4_ = scale * pfVar18[3];
            pfVar18 = (float *)((long)pvVar2 + lVar22 * 2 + lVar17);
            auVar64._0_4_ = scale * *pfVar18;
            auVar64._4_4_ = scale * pfVar18[1];
            auVar64._8_4_ = scale * pfVar18[2];
            auVar64._12_4_ = scale * pfVar18[3];
            auVar54 = vmovlhps_avx(auVar59,auVar64);
            auVar67 = vunpckhpd_avx(auVar59,auVar64);
            auVar24 = vandps_avx(auVar54,auVar25);
            auVar27 = vandps_avx(auVar67,auVar25);
            auVar24 = vorps_avx(auVar24,auVar28);
            auVar27 = vorps_avx(auVar27,auVar28);
            auVar65._0_4_ = (int)(auVar24._0_4_ + auVar54._0_4_);
            auVar65._4_4_ = (int)(auVar24._4_4_ + auVar54._4_4_);
            auVar65._8_4_ = (int)(auVar24._8_4_ + auVar54._8_4_);
            auVar65._12_4_ = (int)(auVar24._12_4_ + auVar54._12_4_);
            auVar60._0_4_ = (int)(auVar27._0_4_ + auVar67._0_4_);
            auVar60._4_4_ = (int)(auVar27._4_4_ + auVar67._4_4_);
            auVar60._8_4_ = (int)(auVar27._8_4_ + auVar67._8_4_);
            auVar60._12_4_ = (int)(auVar27._12_4_ + auVar67._12_4_);
            auVar24 = vpackssdw_avx(auVar65,auVar60);
            auVar24 = vpminsw_avx(auVar24,auVar31);
            auVar24 = vpmaxsw_avx(auVar24,auVar35);
            auVar24 = vpacksswb_avx(auVar24,auVar24);
            *(long *)(*pauVar7 + lVar22) = auVar24._0_8_;
            puVar21 = puVar21 + 2;
            lVar22 = lVar22 + 8;
            iVar5 = iVar5 + 4;
          } while (iVar5 < max_kk);
          pauVar7 = (undefined1 (*) [16])(*pauVar7 + lVar22);
          uVar14 = max_kk & 0xfffffffc;
        }
        uVar12 = uVar14 | 1;
        while ((int)uVar12 < max_kk) {
          auVar61._8_8_ = 0;
          auVar61._0_8_ = *(ulong *)((long)puVar21 + lVar9 * 4);
          auVar66._8_8_ = 0;
          auVar66._0_8_ = *puVar21;
          auVar24 = vmovlhps_avx(auVar66,auVar61);
          auVar62._0_4_ = scale * auVar24._0_4_;
          auVar62._4_4_ = scale * auVar24._4_4_;
          auVar62._8_4_ = scale * auVar24._8_4_;
          auVar62._12_4_ = scale * auVar24._12_4_;
          auVar24 = vandps_avx(auVar62,auVar25);
          auVar24 = vorps_avx(auVar24,auVar28);
          auVar63._0_4_ = (int)(auVar24._0_4_ + auVar62._0_4_);
          auVar63._4_4_ = (int)(auVar24._4_4_ + auVar62._4_4_);
          auVar63._8_4_ = (int)(auVar24._8_4_ + auVar62._8_4_);
          auVar63._12_4_ = (int)(auVar24._12_4_ + auVar62._12_4_);
          auVar24 = vpackssdw_avx(auVar63,auVar63);
          auVar24 = vpminsw_avx(auVar24,auVar31);
          auVar24 = vpmaxsw_avx(auVar24,auVar35);
          auVar24 = vpacksswb_avx(auVar24,auVar24);
          *(int *)*pauVar7 = auVar24._0_4_;
          pauVar7 = (undefined1 (*) [16])(*pauVar7 + 4);
          puVar21 = puVar21 + 1;
          uVar12 = uVar14 + 3;
          uVar14 = uVar14 + 2;
        }
        if ((int)uVar14 < max_kk) {
          lVar22 = 0;
          do {
            fVar81 = scale * *(float *)((long)puVar21 + lVar22 * 4);
            auVar24 = vandps_avx(ZEXT416((uint)fVar81),auVar39);
            auVar24 = vorps_avx(auVar24,auVar50);
            auVar24 = ZEXT416((uint)(auVar24._0_4_ + fVar81));
            auVar24 = vroundss_avx(auVar24,auVar24,0xb);
            iVar5 = (int)auVar24._0_4_;
            if (iVar5 < -0x7e) {
              iVar5 = -0x7f;
            }
            if (0x7e < iVar5) {
              iVar5 = 0x7f;
            }
            (*pauVar7)[0] = (char)iVar5;
            fVar81 = scale * *(float *)((long)puVar21 + lVar22 * 4 + lVar9 * 4);
            auVar24 = vandps_avx(ZEXT416((uint)fVar81),auVar39);
            auVar24 = vorps_avx(auVar24,auVar50);
            auVar24 = ZEXT416((uint)(auVar24._0_4_ + fVar81));
            auVar24 = vroundss_avx(auVar24,auVar24,0xb);
            iVar5 = (int)auVar24._0_4_;
            if (iVar5 < -0x7e) {
              iVar5 = -0x7f;
            }
            if (0x7e < iVar5) {
              iVar5 = 0x7f;
            }
            (*pauVar7)[1] = (char)iVar5;
            pauVar7 = (undefined1 (*) [16])(*pauVar7 + 2);
            lVar22 = lVar22 + 1;
          } while (max_kk - uVar14 != (int)lVar22);
        }
        uVar20 = uVar15 + 2;
        lVar22 = uVar15 + 3;
        lVar17 = lVar17 + lVar9 * 8;
        lVar23 = lVar23 + lVar9 * 8;
        uVar15 = uVar20;
      } while (lVar22 < lVar13);
    }
    if ((int)uVar20 < max_jj) {
      lVar23 = (long)(int)uVar20;
      auVar26._8_4_ = 0x80000000;
      auVar26._0_8_ = 0x8000000080000000;
      auVar26._12_4_ = 0x80000000;
      auVar29._8_4_ = 0x3f000000;
      auVar29._0_8_ = 0x3f0000003f000000;
      auVar29._12_4_ = 0x3f000000;
      auVar32._8_2_ = 0x7f;
      auVar32._0_8_ = 0x7f007f007f007f;
      auVar32._10_2_ = 0x7f;
      auVar32._12_2_ = 0x7f;
      auVar32._14_2_ = 0x7f;
      auVar36._8_2_ = 0xff81;
      auVar36._0_8_ = 0xff81ff81ff81ff81;
      auVar36._10_2_ = 0xff81;
      auVar36._12_2_ = 0xff81;
      auVar36._14_2_ = 0xff81;
      auVar40._8_4_ = 0x3effffff;
      auVar40._0_8_ = 0x3effffff3effffff;
      auVar40._12_4_ = 0x3effffff;
      do {
        pfVar18 = (float *)((long)B->data + lVar16 * 4 + (lVar8 + lVar23) * lVar9 * 4);
        if (max_kk < 4) {
          uVar14 = 0;
        }
        else {
          iVar5 = 3;
          do {
            auVar51._0_4_ = scale * *pfVar18;
            auVar51._4_4_ = scale * pfVar18[1];
            auVar51._8_4_ = scale * pfVar18[2];
            auVar51._12_4_ = scale * pfVar18[3];
            auVar24 = vandps_avx(auVar51,auVar26);
            auVar24 = vorps_avx(auVar24,auVar29);
            auVar52._0_4_ = (int)(auVar51._0_4_ + auVar24._0_4_);
            auVar52._4_4_ = (int)(auVar51._4_4_ + auVar24._4_4_);
            auVar52._8_4_ = (int)(auVar51._8_4_ + auVar24._8_4_);
            auVar52._12_4_ = (int)(auVar51._12_4_ + auVar24._12_4_);
            auVar24 = vpackssdw_avx(auVar52,auVar52);
            auVar24 = vpminsw_avx(auVar24,auVar32);
            auVar24 = vpmaxsw_avx(auVar24,auVar36);
            auVar24 = vpacksswb_avx(auVar24,auVar24);
            *(int *)*pauVar7 = auVar24._0_4_;
            pauVar7 = (undefined1 (*) [16])(*pauVar7 + 4);
            pfVar18 = pfVar18 + 4;
            iVar5 = iVar5 + 4;
            uVar14 = max_kk & 0xfffffffc;
          } while (iVar5 < max_kk);
        }
        if ((int)uVar14 < max_kk) {
          lVar17 = 0;
          do {
            auVar24 = vandps_avx(ZEXT416((uint)(scale * pfVar18[lVar17])),auVar26);
            auVar24 = vorps_avx(auVar24,auVar40);
            auVar24 = ZEXT416((uint)(scale * pfVar18[lVar17] + auVar24._0_4_));
            auVar24 = vroundss_avx(auVar24,auVar24,0xb);
            iVar5 = (int)auVar24._0_4_;
            if (iVar5 < -0x7e) {
              iVar5 = -0x7f;
            }
            if (0x7e < iVar5) {
              iVar5 = 0x7f;
            }
            (*pauVar7)[lVar17] = (char)iVar5;
            lVar17 = lVar17 + 1;
          } while (max_kk - uVar14 != (int)lVar17);
          pauVar7 = (undefined1 (*) [16])(*pauVar7 + lVar17);
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 != lVar13);
    }
    return;
  }
  pack_B_tile_fp32_to_int8_avxvnni(B,BT,j,max_jj,k,max_kk,scale);
  return;
}

Assistant:

void pack_B_tile_fp32_to_int8_avx2(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk, float scale)
{
    pack_B_tile_fp32_to_int8(B, BT, j, max_jj, k, max_kk, scale);
}